

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>,false>
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                begin,__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      end,int param_3,uint param_4)

{
  int iVar1;
  pair<int,_int> pVar2;
  bool bVar3;
  long lVar4;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var5;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var6;
  ulong uVar7;
  ulong uVar8;
  pair<int,_int> *ppVar9;
  pair<int,_int> *ppVar10;
  pair<int,_int> *ppVar11;
  int iVar12;
  pair<int,_int> *ppVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  pair<int,_int> *ppVar17;
  long lVar18;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_bool>
  pVar19;
  _Iter_comp_iter<std::less<std::pair<int,_int>_>_> __cmp;
  _Iter_comp_iter<std::less<std::pair<int,_int>_>_> __cmp_1;
  int local_3c;
  _Iter_comp_iter<std::less<std::pair<int,_int>_>_> local_36;
  _Iter_comp_iter<std::less<std::pair<int,_int>_>_> local_35;
  uint local_34;
  
  local_3c = param_3;
  do {
    uVar8 = (long)end._M_current - (long)begin._M_current >> 3;
    if ((long)uVar8 < 0x18) {
      ppVar13 = begin._M_current + 1;
      bVar3 = ppVar13 == end._M_current || begin._M_current == end._M_current;
      if ((param_4 & 1) == 0) {
        _Var6._M_current = begin._M_current;
        if (bVar3) goto LAB_00378c42;
        do {
          if ((_Var6._M_current[1].first < (_Var6._M_current)->first) ||
             ((_Var6._M_current[1].first <= (_Var6._M_current)->first &&
              (_Var6._M_current[1].second < (_Var6._M_current)->second)))) {
            pVar2 = *ppVar13;
            while( true ) {
              _Var6._M_current[1] = *_Var6._M_current;
              iVar12 = pVar2.first;
              if ((_Var6._M_current[-1].first <= iVar12) &&
                 ((iVar16 = pVar2.second, _Var6._M_current[-1].first < iVar12 ||
                  (_Var6._M_current[-1].second <= iVar16)))) break;
              _Var6._M_current = _Var6._M_current + -1;
            }
            (_Var6._M_current)->first = iVar12;
            (_Var6._M_current)->second = iVar16;
          }
          ppVar17 = ppVar13 + 1;
          _Var6._M_current = ppVar13;
          ppVar13 = ppVar17;
        } while (ppVar17 != end._M_current);
      }
      else {
        if (bVar3) goto LAB_00378c42;
        lVar4 = 0;
        _Var6._M_current = begin._M_current;
        do {
          iVar12 = (_Var6._M_current)->first;
          if ((_Var6._M_current[1].first < iVar12) ||
             ((_Var6._M_current[1].first <= iVar12 &&
              (_Var6._M_current[1].second < (_Var6._M_current)->second)))) {
            pVar2 = _Var6._M_current[1];
            ppVar17 = ppVar13 + -1;
            _Var6._M_current[1].first = iVar12;
            ppVar13->second = (_Var6._M_current)->second;
            iVar16 = pVar2.second;
            iVar12 = pVar2.first;
            ppVar11 = ppVar13;
            lVar18 = lVar4;
            if (ppVar17 != begin._M_current) {
              do {
                ppVar9 = ppVar17;
                iVar1 = ppVar9[-1].first;
                if (iVar1 <= iVar12) {
                  ppVar17 = ppVar9;
                  if (iVar1 < iVar12) {
                    ppVar11 = ppVar9 + 1;
                    break;
                  }
                  if (ppVar9[-1].second <= iVar16) break;
                }
                ppVar17 = ppVar9 + -1;
                ppVar9->first = iVar1;
                ppVar9->second = ppVar9[-1].second;
                lVar18 = lVar18 + 8;
                ppVar11 = ppVar9;
              } while (lVar18 != 0);
            }
            ppVar17->first = iVar12;
            ppVar11[-1].second = iVar16;
          }
          ppVar17 = ppVar13 + 1;
          lVar4 = lVar4 + -8;
          _Var6._M_current = ppVar13;
          ppVar13 = ppVar17;
        } while (ppVar17 != end._M_current);
      }
LAB_003785a3:
      bVar3 = true;
    }
    else {
      uVar7 = uVar8 >> 1;
      _Var6._M_current = begin._M_current + uVar7;
      if ((long)uVar8 < 0x81) {
        iVar12 = (begin._M_current)->first;
        iVar16 = (_Var6._M_current)->first;
        if ((iVar12 < iVar16) ||
           ((iVar12 <= iVar16 && ((begin._M_current)->second < (_Var6._M_current)->second)))) {
          (_Var6._M_current)->first = iVar12;
          (begin._M_current)->first = iVar16;
          iVar12 = (_Var6._M_current)->second;
          (_Var6._M_current)->second = (begin._M_current)->second;
          (begin._M_current)->second = iVar12;
        }
        iVar12 = end._M_current[-1].first;
        iVar16 = (begin._M_current)->first;
        if ((iVar12 < iVar16) ||
           ((iVar12 <= iVar16 && (end._M_current[-1].second < (begin._M_current)->second)))) {
          (begin._M_current)->first = iVar12;
          end._M_current[-1].first = iVar16;
          iVar12 = (begin._M_current)->second;
          (begin._M_current)->second = end._M_current[-1].second;
          end._M_current[-1].second = iVar12;
        }
        iVar12 = (begin._M_current)->first;
        iVar16 = (_Var6._M_current)->first;
        if ((iVar12 < iVar16) ||
           ((iVar12 <= iVar16 && ((begin._M_current)->second < (_Var6._M_current)->second)))) {
          (_Var6._M_current)->first = iVar12;
          (begin._M_current)->first = iVar16;
          _Var5._M_current = begin._M_current;
          goto LAB_003788a8;
        }
      }
      else {
        iVar12 = (_Var6._M_current)->first;
        iVar16 = (begin._M_current)->first;
        if ((iVar12 < iVar16) ||
           ((iVar12 <= iVar16 && ((_Var6._M_current)->second < (begin._M_current)->second)))) {
          (begin._M_current)->first = iVar12;
          (_Var6._M_current)->first = iVar16;
          iVar12 = (begin._M_current)->second;
          (begin._M_current)->second = (_Var6._M_current)->second;
          (_Var6._M_current)->second = iVar12;
        }
        iVar12 = end._M_current[-1].first;
        iVar16 = (_Var6._M_current)->first;
        if ((iVar12 < iVar16) ||
           ((iVar12 <= iVar16 && (end._M_current[-1].second < (_Var6._M_current)->second)))) {
          (_Var6._M_current)->first = iVar12;
          end._M_current[-1].first = iVar16;
          iVar12 = (_Var6._M_current)->second;
          (_Var6._M_current)->second = end._M_current[-1].second;
          end._M_current[-1].second = iVar12;
        }
        iVar12 = (_Var6._M_current)->first;
        iVar16 = (begin._M_current)->first;
        if ((iVar12 < iVar16) ||
           ((iVar12 <= iVar16 && ((_Var6._M_current)->second < (begin._M_current)->second)))) {
          (begin._M_current)->first = iVar12;
          (_Var6._M_current)->first = iVar16;
          iVar12 = (begin._M_current)->second;
          (begin._M_current)->second = (_Var6._M_current)->second;
          (_Var6._M_current)->second = iVar12;
        }
        iVar12 = begin._M_current[uVar7 - 1].first;
        iVar16 = begin._M_current[1].first;
        if ((iVar12 < iVar16) ||
           ((iVar12 <= iVar16 && (begin._M_current[uVar7 - 1].second < begin._M_current[1].second)))
           ) {
          begin._M_current[1].first = iVar12;
          begin._M_current[uVar7 - 1].first = iVar16;
          iVar12 = begin._M_current[1].second;
          begin._M_current[1].second = begin._M_current[uVar7 - 1].second;
          begin._M_current[uVar7 - 1].second = iVar12;
        }
        iVar12 = end._M_current[-2].first;
        iVar16 = begin._M_current[uVar7 - 1].first;
        if ((iVar12 < iVar16) ||
           ((iVar12 <= iVar16 && (end._M_current[-2].second < begin._M_current[uVar7 - 1].second))))
        {
          begin._M_current[uVar7 - 1].first = iVar12;
          end._M_current[-2].first = iVar16;
          iVar12 = begin._M_current[uVar7 - 1].second;
          begin._M_current[uVar7 - 1].second = end._M_current[-2].second;
          end._M_current[-2].second = iVar12;
        }
        iVar12 = begin._M_current[uVar7 - 1].first;
        iVar16 = begin._M_current[1].first;
        if ((iVar12 < iVar16) ||
           ((iVar12 <= iVar16 && (begin._M_current[uVar7 - 1].second < begin._M_current[1].second)))
           ) {
          begin._M_current[1].first = iVar12;
          begin._M_current[uVar7 - 1].first = iVar16;
          iVar12 = begin._M_current[1].second;
          begin._M_current[1].second = begin._M_current[uVar7 - 1].second;
          begin._M_current[uVar7 - 1].second = iVar12;
        }
        iVar12 = begin._M_current[uVar7 + 1].first;
        iVar16 = begin._M_current[2].first;
        if ((iVar12 < iVar16) ||
           ((iVar12 <= iVar16 && (begin._M_current[uVar7 + 1].second < begin._M_current[2].second)))
           ) {
          begin._M_current[2].first = iVar12;
          begin._M_current[uVar7 + 1].first = iVar16;
          iVar12 = begin._M_current[2].second;
          begin._M_current[2].second = begin._M_current[uVar7 + 1].second;
          begin._M_current[uVar7 + 1].second = iVar12;
        }
        iVar12 = end._M_current[-3].first;
        iVar16 = begin._M_current[uVar7 + 1].first;
        if ((iVar12 < iVar16) ||
           ((iVar12 <= iVar16 && (end._M_current[-3].second < begin._M_current[uVar7 + 1].second))))
        {
          begin._M_current[uVar7 + 1].first = iVar12;
          end._M_current[-3].first = iVar16;
          iVar12 = begin._M_current[uVar7 + 1].second;
          begin._M_current[uVar7 + 1].second = end._M_current[-3].second;
          end._M_current[-3].second = iVar12;
        }
        iVar12 = begin._M_current[uVar7 + 1].first;
        iVar16 = begin._M_current[2].first;
        if ((iVar12 < iVar16) ||
           ((iVar12 <= iVar16 && (begin._M_current[uVar7 + 1].second < begin._M_current[2].second)))
           ) {
          begin._M_current[2].first = iVar12;
          begin._M_current[uVar7 + 1].first = iVar16;
          iVar12 = begin._M_current[2].second;
          begin._M_current[2].second = begin._M_current[uVar7 + 1].second;
          begin._M_current[uVar7 + 1].second = iVar12;
        }
        iVar12 = begin._M_current[uVar7 - 1].first;
        iVar16 = begin._M_current[uVar7].first;
        if ((iVar16 < iVar12) ||
           ((iVar16 <= iVar12 &&
            (begin._M_current[uVar7].second < begin._M_current[uVar7 - 1].second)))) {
          begin._M_current[uVar7 - 1].first = iVar16;
          begin._M_current[uVar7].first = iVar12;
          iVar12 = begin._M_current[uVar7 - 1].second;
          begin._M_current[uVar7 - 1].second = begin._M_current[uVar7].second;
          begin._M_current[uVar7].second = iVar12;
        }
        iVar12 = begin._M_current[uVar7].first;
        iVar16 = begin._M_current[uVar7 + 1].first;
        if ((iVar16 < iVar12) ||
           ((iVar16 <= iVar12 &&
            (begin._M_current[uVar7 + 1].second < begin._M_current[uVar7].second)))) {
          begin._M_current[uVar7].first = iVar16;
          begin._M_current[uVar7 + 1].first = iVar12;
          iVar12 = begin._M_current[uVar7].second;
          begin._M_current[uVar7].second = begin._M_current[uVar7 + 1].second;
          begin._M_current[uVar7 + 1].second = iVar12;
        }
        iVar12 = begin._M_current[uVar7 - 1].first;
        iVar16 = begin._M_current[uVar7].first;
        if ((iVar16 < iVar12) ||
           ((iVar16 <= iVar12 &&
            (begin._M_current[uVar7].second < begin._M_current[uVar7 - 1].second)))) {
          begin._M_current[uVar7 - 1].first = iVar16;
          begin._M_current[uVar7].first = iVar12;
          iVar12 = begin._M_current[uVar7 - 1].second;
          begin._M_current[uVar7 - 1].second = begin._M_current[uVar7].second;
          begin._M_current[uVar7].second = iVar12;
        }
        iVar12 = (begin._M_current)->first;
        (begin._M_current)->first = (_Var6._M_current)->first;
        (_Var6._M_current)->first = iVar12;
        _Var5._M_current = _Var6._M_current;
        _Var6._M_current = begin._M_current;
LAB_003788a8:
        iVar12 = (_Var6._M_current)->second;
        (_Var6._M_current)->second = (_Var5._M_current)->second;
        (_Var5._M_current)->second = iVar12;
      }
      if ((param_4 & 1) == 0) {
        if ((begin._M_current[-1].first < (begin._M_current)->first) ||
           ((begin._M_current[-1].first <= (begin._M_current)->first &&
            (begin._M_current[-1].second < (begin._M_current)->second)))) goto LAB_003788ca;
        begin = partition_left<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
                          (begin._M_current,end._M_current);
        begin._M_current = begin._M_current + 1;
        bVar3 = false;
      }
      else {
LAB_003788ca:
        pVar19 = partition_right<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
                           (begin._M_current,end._M_current);
        _Var6 = pVar19.first._M_current;
        uVar14 = (long)_Var6._M_current - (long)begin._M_current >> 3;
        ppVar13 = _Var6._M_current + 1;
        uVar7 = (long)end._M_current - (long)ppVar13 >> 3;
        if (((long)uVar14 < (long)(uVar8 >> 3)) || ((long)uVar7 < (long)(uVar8 >> 3))) {
          local_3c = local_3c + -1;
          if (local_3c == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::pair<int,int>>>>
                      (begin,end,&local_36);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::pair<int,int>>>>
                      (begin,end,&local_35);
            local_3c = 0;
LAB_00378c42:
            bVar3 = true;
            goto LAB_00378c45;
          }
          if (0x17 < (long)uVar14) {
            uVar8 = uVar14 >> 2;
            pVar2 = *begin._M_current;
            *begin._M_current = begin._M_current[uVar8];
            begin._M_current[uVar8] = pVar2;
            pVar2 = _Var6._M_current[-1];
            _Var6._M_current[-1] = _Var6._M_current[-uVar8];
            _Var6._M_current[-uVar8] = pVar2;
            if (0x80 < (long)uVar14) {
              pVar2 = begin._M_current[1];
              begin._M_current[1] = begin._M_current[uVar8 + 1];
              begin._M_current[uVar8 + 1] = pVar2;
              pVar2 = begin._M_current[2];
              begin._M_current[2] = begin._M_current[uVar8 + 2];
              begin._M_current[uVar8 + 2] = pVar2;
              pVar2 = _Var6._M_current[-2];
              _Var6._M_current[-2] = _Var6._M_current[~uVar8];
              _Var6._M_current[~uVar8] = pVar2;
              pVar2 = _Var6._M_current[-3];
              _Var6._M_current[-3] = _Var6._M_current[-2 - uVar8];
              _Var6._M_current[-2 - uVar8] = pVar2;
            }
          }
          if (0x17 < (long)uVar7) {
            uVar8 = uVar7 >> 2;
            pVar2 = _Var6._M_current[1];
            _Var6._M_current[1] = _Var6._M_current[uVar8 + 1];
            _Var6._M_current[uVar8 + 1] = pVar2;
            pVar2 = end._M_current[-1];
            end._M_current[-1] = end._M_current[-uVar8];
            end._M_current[-uVar8] = pVar2;
            if (0x80 < (long)uVar7) {
              pVar2 = _Var6._M_current[2];
              _Var6._M_current[2] = _Var6._M_current[uVar8 + 2];
              _Var6._M_current[uVar8 + 2] = pVar2;
              pVar2 = _Var6._M_current[3];
              _Var6._M_current[3] = _Var6._M_current[uVar8 + 3];
              _Var6._M_current[uVar8 + 3] = pVar2;
              pVar2 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar8];
              end._M_current[~uVar8] = pVar2;
              pVar2 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar8];
              end._M_current[-2 - uVar8] = pVar2;
            }
          }
        }
        else if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (begin._M_current == _Var6._M_current) {
LAB_00378b35:
            if (ppVar13 == end._M_current) goto LAB_00378c42;
            lVar4 = 8;
            lVar18 = 0;
            uVar8 = 0;
            do {
              ppVar17 = (pair<int,_int> *)((long)&_Var6._M_current[1].first + lVar4);
              local_34 = param_4;
              if (ppVar17 == end._M_current) goto LAB_003785a3;
              ppVar11 = (pair<int,_int> *)((long)&(_Var6._M_current)->first + lVar4);
              iVar12 = ppVar11->first;
              if ((ppVar17->first < iVar12) ||
                 ((ppVar17->first <= iVar12 && (ppVar11[1].second < ppVar11->second)))) {
                pVar2 = *ppVar17;
                ppVar17->first = iVar12;
                ppVar11[1].second = ppVar11->second;
                iVar16 = pVar2.second;
                iVar12 = pVar2.first;
                ppVar9 = ppVar17;
                ppVar10 = ppVar11;
                lVar15 = lVar18;
                if (lVar4 != 8) {
                  do {
                    iVar1 = ppVar10[-1].first;
                    if (iVar1 <= iVar12) {
                      ppVar11 = ppVar10;
                      if (iVar1 < iVar12) {
                        ppVar9 = ppVar10 + 1;
                        break;
                      }
                      if (ppVar10[-1].second <= iVar16) break;
                    }
                    ppVar11 = ppVar10 + -1;
                    ppVar10->first = iVar1;
                    ppVar10->second = ppVar10[-1].second;
                    lVar15 = lVar15 + 8;
                    ppVar9 = ppVar10;
                    ppVar10 = ppVar11;
                  } while (lVar15 != 0);
                }
                ppVar11->first = iVar12;
                ppVar9[-1].second = iVar16;
                uVar8 = uVar8 + ((long)ppVar17 - (long)ppVar11 >> 3);
              }
              lVar4 = lVar4 + 8;
              lVar18 = lVar18 + -8;
            } while (uVar8 < 9);
          }
          else {
            lVar4 = 0;
            uVar8 = 0;
            _Var5._M_current = begin._M_current;
            do {
              ppVar17 = _Var5._M_current + 1;
              if (ppVar17 == _Var6._M_current) goto LAB_00378b35;
              iVar12 = (_Var5._M_current)->first;
              if ((_Var5._M_current[1].first < iVar12) ||
                 ((_Var5._M_current[1].first <= iVar12 &&
                  (_Var5._M_current[1].second < (_Var5._M_current)->second)))) {
                pVar2 = _Var5._M_current[1];
                _Var5._M_current[1].first = iVar12;
                _Var5._M_current[1].second = (_Var5._M_current)->second;
                iVar16 = pVar2.second;
                iVar12 = pVar2.first;
                ppVar11 = ppVar17;
                lVar18 = lVar4;
                if (_Var5._M_current != begin._M_current) {
                  do {
                    ppVar9 = _Var5._M_current;
                    iVar1 = ppVar9[-1].first;
                    if (iVar1 <= iVar12) {
                      _Var5._M_current = ppVar9;
                      if (iVar1 < iVar12) {
                        ppVar11 = ppVar9 + 1;
                        break;
                      }
                      if (ppVar9[-1].second <= iVar16) break;
                    }
                    _Var5._M_current = ppVar9 + -1;
                    ppVar9->first = iVar1;
                    ppVar9->second = ppVar9[-1].second;
                    lVar18 = lVar18 + 8;
                    ppVar11 = ppVar9;
                  } while (lVar18 != 0);
                }
                (_Var5._M_current)->first = iVar12;
                ppVar11[-1].second = iVar16;
                uVar8 = uVar8 + ((long)ppVar17 - (long)_Var5._M_current >> 3);
              }
              lVar4 = lVar4 + -8;
              _Var5._M_current = ppVar17;
            } while (uVar8 < 9);
          }
        }
        pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>,false>
                  (begin._M_current,_Var6._M_current,local_3c);
        bVar3 = false;
        param_4 = 0;
        begin._M_current = ppVar13;
      }
    }
LAB_00378c45:
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }